

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

void __thiscall leveldb::VersionEdit::Clear(VersionEdit *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear(in_RDI);
  in_RDI[1]._M_dataplus._M_p = (pointer)0x0;
  in_RDI[1]._M_string_length = 0;
  *(undefined8 *)((long)&in_RDI[1].field_2 + 8) = 0;
  in_RDI[1].field_2._M_allocated_capacity = 0;
  *(undefined1 *)&in_RDI[2]._M_dataplus._M_p = 0;
  *(undefined1 *)((long)&in_RDI[2]._M_dataplus._M_p + 1) = 0;
  *(undefined1 *)((long)&in_RDI[2]._M_dataplus._M_p + 2) = 0;
  *(undefined1 *)((long)&in_RDI[2]._M_dataplus._M_p + 3) = 0;
  *(undefined1 *)((long)&in_RDI[2]._M_dataplus._M_p + 4) = 0;
  std::
  set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  ::clear((set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
           *)in_RDI);
  std::
  vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ::clear((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
           *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VersionEdit::Clear() {
  comparator_.clear();
  log_number_ = 0;
  prev_log_number_ = 0;
  last_sequence_ = 0;
  next_file_number_ = 0;
  has_comparator_ = false;
  has_log_number_ = false;
  has_prev_log_number_ = false;
  has_next_file_number_ = false;
  has_last_sequence_ = false;
  deleted_files_.clear();
  new_files_.clear();
}